

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<float>::SolveDirect
          (TPZMatrix<float> *this,TPZFMatrix<float> *B,DecomposeType dt,
          list<long,_std::allocator<long>_> *singular)

{
  int iVar1;
  
  if (dt == ELDLt) {
    iVar1 = Solve_LDLt(this,B,singular);
    return iVar1;
  }
  if (dt != ECholesky) {
    if (dt == ELU) {
      iVar1 = Solve_LU(this,B,singular);
      return iVar1;
    }
    Error("Solve  < Unknown decomposition type >",(char *)0x0);
    return 0;
  }
  iVar1 = Solve_Cholesky(this,B,singular);
  return iVar1;
}

Assistant:

int TPZMatrix<TVar>::SolveDirect( TPZFMatrix<TVar> &B , DecomposeType dt, std::list<int64_t> &singular) {
	
	switch ( dt ) {
		case ELU:
			return( Solve_LU( &B ,singular)  );
		case ECholesky:
			return( Solve_Cholesky( &B , singular)  );
		case ELDLt:
			return( Solve_LDLt( &B, singular )  );
		default:
			Error( "Solve  < Unknown decomposition type >" );
			break;
	}
	return ( 0 );
}